

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

CollationKey * __thiscall
icu_63::RuleBasedCollator::getCollationKey
          (RuleBasedCollator *this,UnicodeString *s,CollationKey *key,UErrorCode *errorCode)

{
  uint uVar1;
  int iVar2;
  char16_t *pcVar3;
  undefined4 extraout_var;
  UErrorCode *errorCode_local;
  CollationKey *key_local;
  UnicodeString *s_local;
  RuleBasedCollator *this_local;
  
  pcVar3 = UnicodeString::getBuffer(s);
  uVar1 = UnicodeString::length(s);
  iVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0xf])
                    (this,pcVar3,(ulong)uVar1,key,errorCode);
  return (CollationKey *)CONCAT44(extraout_var,iVar2);
}

Assistant:

CollationKey &
RuleBasedCollator::getCollationKey(const UnicodeString &s, CollationKey &key,
                                   UErrorCode &errorCode) const {
    return getCollationKey(s.getBuffer(), s.length(), key, errorCode);
}